

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvSlot<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  long lVar2;
  ulong *puVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  
  bVar1 = playout->SlotIndex1;
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar2 = *(long *)(this + 0x88);
  if (*(long *)(lVar2 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00a6976d;
    *puVar7 = 0;
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,uVar6,
                            *(LocalFunctionId *)(*(long *)(lVar2 + 0x10) + 0x10));
  if ((bVar5) || ((ulong)bVar1 - 1 < (ulong)*(ushort *)((long)instance + 2))) {
    puVar3 = *(ulong **)((long)instance + (ulong)bVar1 * 8);
    bVar1 = playout->SlotIndex2;
    uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
    lVar2 = *(long *)(this + 0x88);
    if (*(long *)(lVar2 + 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) {
LAB_00a6976d:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,uVar6,
                              *(LocalFunctionId *)(*(long *)(lVar2 + 0x10) + 0x10));
    if ((bVar5) || ((ulong)(bVar1 - 2) < *puVar3)) {
      return (Var)puVar3[bVar1];
    }
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }